

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

cmSourceFile * __thiscall
cmLocalGenerator::AddCustomCommandToOutput
          (cmLocalGenerator *this,
          unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *cc,bool replace)

{
  bool bVar1;
  pointer pcVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_78;
  cmListFileBacktrace local_70 [2];
  allocator<char> local_49;
  string local_48;
  byte local_21;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *puStack_20;
  bool replace_local;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *cc_local;
  cmLocalGenerator *this_local;
  
  local_21 = replace;
  puStack_20 = cc;
  cc_local = (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)this;
  pcVar2 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->(cc);
  this_00 = cmCustomCommand::GetOutputs_abi_cxx11_(pcVar2);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(this_00);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Attempt to add a custom rule with no output!",&local_49);
    cmSystemTools::Error(&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    this_local = (cmLocalGenerator *)0x0;
  }
  else {
    pcVar2 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->(cc)
    ;
    cmListFileBacktrace::cmListFileBacktrace(local_70,&this->DirectoryBacktrace);
    cmCustomCommand::SetBacktrace(pcVar2,local_70);
    cmListFileBacktrace::~cmListFileBacktrace(local_70);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::unique_ptr
              (&local_78,cc);
    this_local = (cmLocalGenerator *)
                 detail::AddCustomCommandToOutput(this,Generator,&local_78,(bool)(local_21 & 1));
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&local_78);
  }
  return (cmSourceFile *)this_local;
}

Assistant:

cmSourceFile* cmLocalGenerator::AddCustomCommandToOutput(
  std::unique_ptr<cmCustomCommand> cc, bool replace)
{
  // Make sure there is at least one output.
  if (cc->GetOutputs().empty()) {
    cmSystemTools::Error("Attempt to add a custom rule with no output!");
    return nullptr;
  }

  cc->SetBacktrace(this->DirectoryBacktrace);
  return detail::AddCustomCommandToOutput(*this, cmCommandOrigin::Generator,
                                          std::move(cc), replace);
}